

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_codec.c
# Opt level: O0

int frame_codec_subscribe
              (FRAME_CODEC_HANDLE frame_codec,uint8_t type,ON_FRAME_RECEIVED on_frame_received,
              void *callback_context)

{
  LOGGER_LOG p_Var1;
  LIST_ITEM_HANDLE pLVar2;
  void *pvVar3;
  byte *item;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 uVar4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LIST_ITEM_HANDLE list_item;
  SUBSCRIPTION *subscription;
  FRAME_CODEC_INSTANCE *frame_codec_data;
  LOGGER_LOG l;
  int result;
  void *callback_context_local;
  ON_FRAME_RECEIVED on_frame_received_local;
  FRAME_CODEC_HANDLE pFStack_10;
  uint8_t type_local;
  FRAME_CODEC_HANDLE frame_codec_local;
  
  uVar4 = (undefined4)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  on_frame_received_local._7_1_ = type;
  pFStack_10 = frame_codec;
  if ((frame_codec == (FRAME_CODEC_HANDLE)0x0) || (on_frame_received == (ON_FRAME_RECEIVED)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/frame_codec.c"
                ,"frame_codec_subscribe",0x1ce,1,
                "Bad arguments: frame_codec = %p, on_frame_received = %p",pFStack_10,
                on_frame_received);
    }
    l._4_4_ = 0x1cf;
  }
  else {
    pLVar2 = singlylinkedlist_find
                       (frame_codec->subscription_list,find_subscription_by_frame_type,
                        (void *)((long)&on_frame_received_local + 7));
    if (pLVar2 == (LIST_ITEM_HANDLE)0x0) {
      item = (byte *)calloc(1,0x18);
      if (item == (byte *)0x0) {
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 != (LOGGER_LOG)0x0) {
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/frame_codec.c"
                    ,"frame_codec_subscribe",499,1,"Cannot allocate memory for new subscription");
        }
        l._4_4_ = 500;
      }
      else {
        *(ON_FRAME_RECEIVED *)(item + 8) = on_frame_received;
        *(void **)(item + 0x10) = callback_context;
        *item = on_frame_received_local._7_1_;
        pLVar2 = singlylinkedlist_add(frame_codec->subscription_list,item);
        if (pLVar2 == (LIST_ITEM_HANDLE)0x0) {
          free(item);
          p_Var1 = xlogging_get_log_function();
          if (p_Var1 != (LOGGER_LOG)0x0) {
            (*p_Var1)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/frame_codec.c"
                      ,"frame_codec_subscribe",0x200,1,"Cannot add subscription to list");
          }
          l._4_4_ = 0x201;
        }
        else {
          l._4_4_ = 0;
        }
      }
    }
    else {
      pvVar3 = singlylinkedlist_item_get_value(pLVar2);
      if (pvVar3 == (void *)0x0) {
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 != (LOGGER_LOG)0x0) {
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/frame_codec.c"
                    ,"frame_codec_subscribe",0x1df,1,
                    "Cannot retrieve subscription information from the list for type %u",
                    CONCAT44(uVar4,(uint)on_frame_received_local._7_1_));
        }
        l._4_4_ = 0x1e0;
      }
      else {
        *(ON_FRAME_RECEIVED *)((long)pvVar3 + 8) = on_frame_received;
        *(void **)((long)pvVar3 + 0x10) = callback_context;
        l._4_4_ = 0;
      }
    }
  }
  return l._4_4_;
}

Assistant:

int frame_codec_subscribe(FRAME_CODEC_HANDLE frame_codec, uint8_t type, ON_FRAME_RECEIVED on_frame_received, void* callback_context)
{
    int result;

    /* Codes_SRS_FRAME_CODEC_01_034: [If any of the frame_codec or on_frame_received arguments is NULL, frame_codec_subscribe shall return a non-zero value.] */
    if ((frame_codec == NULL) ||
        (on_frame_received == NULL))
    {
        LogError("Bad arguments: frame_codec = %p, on_frame_received = %p",
            frame_codec, on_frame_received);
        result = MU_FAILURE;
    }
    else
    {
        FRAME_CODEC_INSTANCE* frame_codec_data = (FRAME_CODEC_INSTANCE*)frame_codec;
        SUBSCRIPTION* subscription;

        /* Codes_SRS_FRAME_CODEC_01_036: [Only one callback pair shall be allowed to be registered for a given frame type.] */
        /* find the subscription for this frame type */
        LIST_ITEM_HANDLE list_item = singlylinkedlist_find(frame_codec_data->subscription_list, find_subscription_by_frame_type, &type);
        if (list_item != NULL)
        {
            subscription = (SUBSCRIPTION*)singlylinkedlist_item_get_value(list_item);
            if (subscription == NULL)
            {
                /* Codes_SRS_FRAME_CODEC_01_037: [If any failure occurs while performing the subscribe operation, frame_codec_subscribe shall return a non-zero value.] */
                LogError("Cannot retrieve subscription information from the list for type %u", (unsigned int)type);
                result = MU_FAILURE;
            }
            else
            {
                /* a subscription was found */
                subscription->on_frame_received = on_frame_received;
                subscription->callback_context = callback_context;

                /* Codes_SRS_FRAME_CODEC_01_087: [On success, frame_codec_subscribe shall return zero.] */
                result = 0;
            }
        }
        else
        {
            /* add a new subscription */
            subscription = (SUBSCRIPTION*)calloc(1, sizeof(SUBSCRIPTION));
            /* Codes_SRS_FRAME_CODEC_01_037: [If any failure occurs while performing the subscribe operation, frame_codec_subscribe shall return a non-zero value.] */
            if (subscription == NULL)
            {
                LogError("Cannot allocate memory for new subscription");
                result = MU_FAILURE;
            }
            else
            {
                subscription->on_frame_received = on_frame_received;
                subscription->callback_context = callback_context;
                subscription->frame_type = type;

                /* Codes_SRS_FRAME_CODEC_01_037: [If any failure occurs while performing the subscribe operation, frame_codec_subscribe shall return a non-zero value.] */
                if (singlylinkedlist_add(frame_codec_data->subscription_list, subscription) == NULL)
                {
                    free(subscription);
                    LogError("Cannot add subscription to list");
                    result = MU_FAILURE;
                }
                else
                {
                    /* Codes_SRS_FRAME_CODEC_01_087: [On success, frame_codec_subscribe shall return zero.] */
                    result = 0;
                }
            }
        }
    }

    return result;
}